

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace.cpp
# Opt level: O0

void __thiscall
LiteScript::_Type_NAMESPACE::Save
          (_Type_NAMESPACE *this,ostream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Object *pOVar1;
  uint v;
  char *pcVar2;
  ostream *poVar3;
  Object *pOVar4;
  long *plVar5;
  offset_in_Memory_to_subr in_R8;
  Namespace *local_98;
  undefined1 local_60 [24];
  uint sz;
  uint i;
  Namespace *obj;
  offset_in_Memory_to_subr caller_local;
  Object *local_30;
  Object *object_local;
  ostream *stream_local;
  _Type_NAMESPACE *this_local;
  
  obj = (Namespace *)caller;
  caller_local = in_R8;
  local_30 = object;
  object_local = (Object *)stream;
  stream_local = (ostream *)this;
  this_local = (_Type_NAMESPACE *)caller;
  _sz = (Memory *)Object::GetData<LiteScript::Namespace>(object);
  pOVar1 = object_local;
  v = Namespace::Count((Namespace *)_sz);
  OStreamer::Write<unsigned_int>((ostream *)pOVar1,v);
  local_60._20_4_ = 0;
  local_60._16_4_ = Namespace::Count((Namespace *)_sz);
  for (; pOVar1 = object_local, (uint)local_60._20_4_ < (uint)local_60._16_4_;
      local_60._20_4_ = local_60._20_4_ + 1) {
    pcVar2 = Namespace::GetKey((Namespace *)_sz,local_60._20_4_);
    poVar3 = std::operator<<((ostream *)pOVar1,pcVar2);
    std::operator<<(poVar3,'\0');
    pOVar1 = object_local;
    plVar5 = (long *)((long)(local_30->memory->arr)._M_elems + caller_local);
    if (((ulong)obj & 1) == 0) {
      local_98 = obj;
    }
    else {
      local_98 = *(Namespace **)((long)obj + *plVar5 + -1);
    }
    Namespace::GetVariable((Namespace *)local_60,(uint)_sz);
    pOVar4 = Variable::operator->((Variable *)local_60);
    (*(code *)local_98)(plVar5,pOVar1,pOVar4->ID);
    Variable::~Variable((Variable *)local_60);
  }
  return;
}

Assistant:

void LiteScript::_Type_NAMESPACE::Save(std::ostream &stream, Object &object, bool (Memory::*caller)(std::ostream&, unsigned int)) const {
    Namespace& obj = object.GetData<Namespace>();
    OStreamer::Write<unsigned int>(stream, obj.Count());
    for (unsigned int i = 0, sz = obj.Count(); i < sz; i++) {
        stream << obj.GetKey(i) << (uint8_t)0;
        (object.memory.*caller)(stream, obj.GetVariable(i)->ID);
    }
}